

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O2

void __thiscall
SwitchIRBuilder::SetProfiledInstruction(SwitchIRBuilder *this,Instr *instr,ProfileId profileId)

{
  bool bVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  JITTimeProfileInfo *this_00;
  ProfiledInstr *pPVar3;
  char16 *pcVar4;
  char local_188 [8];
  char valueTypeStr [256];
  char16 debugStringBuffer [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType valueType;
  
  this->m_profiledSwitchInstr = instr;
  this->m_switchOptBuildBail = true;
  if ((instr->m_kind == InstrKindProfiled) && (bVar1 = Func::HasProfileInfo(instr->m_func), bVar1))
  {
    this_00 = Func::GetReadOnlyProfileInfo(this->m_profiledSwitchInstr->m_func);
    aVar2.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         JITTimeProfileInfo::GetSwitchProfileInfo(this_00,profileId);
    local_2a[0].field_0 = aVar2.field_0;
    pPVar3 = IR::Instr::AsProfiledInstr(instr);
    (pPVar3->u).field_3.fldInfoData.f1 = (TSize)aVar2;
    bVar1 = ValueType::IsLikelyTaggedInt((ValueType *)&local_2a[0].field_0);
    this->m_switchIntDynProfile = bVar1;
    bVar1 = ValueType::IsLikelyString((ValueType *)&local_2a[0].field_0);
    this->m_switchStrDynProfile = bVar1;
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,SwitchOptPhase);
    if (bVar1) {
      ValueType::ToString((ValueType *)&local_2a[0].field_0,(char (*) [256])local_188);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,SwitchOptPhase);
      if (bVar1) {
        pcVar4 = Func::GetDebugNumberSet
                           (this->m_profiledSwitchInstr->m_func,
                            (wchar (*) [42])(valueTypeStr + 0xf8));
        pPVar3 = IR::Instr::AsProfiledInstr(this->m_profiledSwitchInstr);
        Output::Print(L"Func %s, Switch %d: Expression Type : %S\n",pcVar4,
                      (ulong)(pPVar3->u).profileId,local_188);
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void
SwitchIRBuilder::SetProfiledInstruction(IR::Instr * instr, Js::ProfileId profileId)
{
    m_profiledSwitchInstr = instr;
    m_switchOptBuildBail = true;

    //don't optimize if the switch expression is not an Integer (obtained via dynamic profiling data of the BeginSwitch opcode)

    bool hasProfile = m_profiledSwitchInstr->IsProfiledInstr() && m_profiledSwitchInstr->m_func->HasProfileInfo();

    if (hasProfile)
    {
        const ValueType valueType(m_profiledSwitchInstr->m_func->GetReadOnlyProfileInfo()->GetSwitchProfileInfo(profileId));
        instr->AsProfiledInstr()->u.FldInfo().valueType = valueType;
        m_switchIntDynProfile = valueType.IsLikelyTaggedInt();
        m_switchStrDynProfile = valueType.IsLikelyString();

        if (PHASE_TESTTRACE1(Js::SwitchOptPhase))
        {
            char valueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            valueType.ToString(valueTypeStr);
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            PHASE_PRINT_TESTTRACE1(Js::SwitchOptPhase, _u("Func %s, Switch %d: Expression Type : %S\n"),
                m_profiledSwitchInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                m_profiledSwitchInstr->AsProfiledInstr()->u.profileId, valueTypeStr);
        }
    }
}